

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::GetTypeInstruction(TypeManager *this,Type *type)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> init_list_04;
  initializer_list<unsigned_int> init_list_05;
  initializer_list<unsigned_int> init_list_06;
  initializer_list<unsigned_int> init_list_07;
  initializer_list<unsigned_int> init_list_08;
  initializer_list<unsigned_int> init_list_09;
  initializer_list<unsigned_int> init_list_10;
  initializer_list<unsigned_int> init_list_11;
  initializer_list<unsigned_int> init_list_12;
  initializer_list<unsigned_int> init_list_13;
  initializer_list<unsigned_int> init_list_14;
  initializer_list<unsigned_int> init_list_15;
  initializer_list<unsigned_int> init_list_16;
  initializer_list<unsigned_int> init_list_17;
  initializer_list<unsigned_int> init_list_18;
  initializer_list<unsigned_int> init_list_19;
  initializer_list<unsigned_int> init_list_20;
  initializer_list<unsigned_int> init_list_21;
  initializer_list<unsigned_int> init_list_22;
  initializer_list<unsigned_int> init_list_23;
  initializer_list<unsigned_int> init_list_24;
  initializer_list<unsigned_int> init_list_25;
  initializer_list<unsigned_int> init_list_26;
  initializer_list<unsigned_int> init_list_27;
  initializer_list<unsigned_int> init_list_28;
  initializer_list<unsigned_int> init_list_29;
  initializer_list<unsigned_int> init_list_30;
  initializer_list<unsigned_int> init_list_31;
  initializer_list<unsigned_int> init_list_32;
  initializer_list<unsigned_int> init_list_33;
  initializer_list<unsigned_int> init_list_34;
  initializer_list<unsigned_int> init_list_35;
  initializer_list<unsigned_int> init_list_36;
  initializer_list<unsigned_int> init_list_37;
  initializer_list<unsigned_int> init_list_38;
  initializer_list<unsigned_int> init_list_39;
  initializer_list<unsigned_int> init_list_40;
  initializer_list<unsigned_int> init_list_41;
  initializer_list<unsigned_int> init_list_42;
  bool bVar1;
  Kind KVar2;
  int iVar3;
  IRContext *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  string *input;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *pvVar5;
  reference ppTVar6;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  reference puVar7;
  undefined4 extraout_var_23;
  Type *pTVar8;
  iterator_template<spvtools::opt::Instruction> *this_01;
  Instruction *inst;
  Operand *local_1c40;
  Operand *local_1c20;
  Operand *local_1be8;
  Operand *local_1bb8;
  Operand *local_1b98;
  Operand *local_1b80;
  Operand *local_1b60;
  Operand *local_1b48;
  Operand *local_1b30;
  Operand *local_1b18;
  Operand *local_1af8;
  Operand *local_1ae0;
  Operand *local_1a90;
  Operand *local_1a70;
  Operand *local_1a50;
  Operand *local_1a38;
  Operand *local_1a18;
  undefined1 local_1a00 [16];
  spv_operand_table local_19f0;
  spv_opcode_table local_19e8;
  SmallVector<unsigned_int,_2UL> local_19e0;
  uint32_t local_19b4;
  _Invoker_type local_19b0;
  _Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false> local_19a8;
  SmallVector<unsigned_int,_2UL> local_19a0;
  Operand local_1978;
  Operand OStack_1948;
  undefined1 local_1918 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_18f8;
  uint32_t local_18ec;
  CooperativeVectorNV *pCStack_18e8;
  uint32_t component_type_2;
  CooperativeVectorNV *coop_vec;
  IRContext *local_18d8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_18d0;
  uint local_18c4;
  iterator local_18c0;
  size_t local_18b8;
  SmallVector<unsigned_int,_2UL> local_18b0;
  Operand local_1888;
  uint local_1854;
  const_iterator cStack_1850;
  uint p;
  const_iterator __end4_2;
  const_iterator __begin4_2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range4_2;
  __node_base local_1830;
  size_type local_1828;
  SmallVector<unsigned_int,_2UL> local_1820;
  Operand local_17f8;
  uint32_t local_17c4;
  _Head_base<0UL,_spvtools::opt::analysis::LivenessManager_*,_false> local_17c0;
  undefined8 local_17b8;
  SmallVector<unsigned_int,_2UL> local_17b0;
  Operand local_1788;
  undefined1 local_1758 [8];
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  TensorViewNV *tensor_view;
  iterator local_1730;
  undefined8 local_1728;
  SmallVector<unsigned_int,_2UL> local_1720;
  uint32_t local_16f4;
  iterator local_16f0;
  undefined8 local_16e8;
  SmallVector<unsigned_int,_2UL> local_16e0;
  Operand local_16b8;
  Operand OStack_1688;
  undefined1 local_1658 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_1638;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_1630;
  TensorLayoutNV *tensor_layout;
  iterator local_1620;
  undefined8 local_1618;
  SmallVector<unsigned_int,_2UL> local_1610;
  uint32_t local_15e4;
  iterator local_15e0;
  undefined8 local_15d8;
  SmallVector<unsigned_int,_2UL> local_15d0;
  uint32_t local_15a4;
  iterator local_15a0;
  undefined8 local_1598;
  SmallVector<unsigned_int,_2UL> local_1590;
  uint32_t local_1564;
  iterator local_1560;
  undefined8 local_1558;
  SmallVector<unsigned_int,_2UL> local_1550;
  uint32_t local_1524;
  iterator local_1520;
  undefined8 local_1518;
  SmallVector<unsigned_int,_2UL> local_1510;
  Operand local_14e8;
  Operand OStack_14b8;
  Operand OStack_1488;
  Operand OStack_1458;
  Operand OStack_1428;
  undefined1 local_13f8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_13d8;
  uint32_t local_13cc;
  CooperativeMatrixKHR *pCStack_13c8;
  uint32_t component_type_1;
  CooperativeMatrixKHR *coop_mat_1;
  iterator local_13b8;
  undefined8 local_13b0;
  SmallVector<unsigned_int,_2UL> local_13a8;
  uint32_t local_137c;
  iterator local_1378;
  undefined8 local_1370;
  SmallVector<unsigned_int,_2UL> local_1368;
  uint32_t local_133c;
  iterator local_1338;
  undefined8 local_1330;
  SmallVector<unsigned_int,_2UL> local_1328;
  uint32_t local_12fc;
  iterator local_12f8;
  undefined8 local_12f0;
  SmallVector<unsigned_int,_2UL> local_12e8;
  Operand local_12c0;
  Operand OStack_1290;
  Operand OStack_1260;
  Operand OStack_1230;
  undefined1 local_1200 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_11e0;
  uint32_t local_11d4;
  CooperativeMatrixNV *pCStack_11d0;
  uint32_t component_type;
  CooperativeMatrixNV *coop_mat;
  iterator local_11c0;
  undefined8 local_11b8;
  SmallVector<unsigned_int,_2UL> local_11b0;
  uint32_t local_1184;
  iterator local_1180;
  undefined8 local_1178;
  SmallVector<unsigned_int,_2UL> local_1170;
  Operand local_1148;
  Operand OStack_1118;
  undefined1 local_10e8 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_10c0;
  AccessQualifier local_10b4;
  AccessQualifier *local_10b0;
  undefined8 local_10a8;
  SmallVector<unsigned_int,_2UL> local_10a0;
  Operand local_1078;
  undefined1 local_1048 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_1028;
  int local_1020;
  Op local_101c;
  IRContext *local_1018;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_1010;
  uint32_t local_1004;
  iterator local_1000;
  undefined8 local_ff8;
  SmallVector<unsigned_int,_2UL> local_ff0;
  Operand local_fc8;
  uint32_t local_f94;
  Type *pTStack_f90;
  uint32_t paramater_type_id;
  Type *ty_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range4_1;
  iterator local_f68;
  undefined8 local_f60;
  SmallVector<unsigned_int,_2UL> local_f58;
  Operand local_f30;
  uint32_t local_efc;
  Function *pFStack_ef8;
  uint32_t return_type_id;
  Function *function;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops_1;
  SmallVector<unsigned_int,_2UL> local_ec0;
  StorageClass local_e94;
  StorageClass *local_e90;
  undefined8 local_e88;
  SmallVector<unsigned_int,_2UL> local_e80;
  Operand local_e58;
  Operand OStack_e28;
  undefined1 local_df8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_dd8
  ;
  uint32_t local_dcc;
  Pointer *pPStack_dc8;
  uint32_t subtype_7;
  Pointer *pointer;
  Operand local_d98;
  undefined1 local_d68 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_d48
  ;
  undefined1 local_d40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> words;
  Opaque *opaque;
  IRContext *local_d18;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_d10
  ;
  uint32_t local_d04;
  iterator local_d00;
  undefined8 local_cf8;
  SmallVector<unsigned_int,_2UL> local_cf0;
  Operand local_cc8;
  uint32_t local_c94;
  Type *pTStack_c90;
  uint32_t member_type_id;
  Type *ty;
  const_iterator __end4;
  const_iterator __begin4;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range4;
  Struct *structTy;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> ops;
  SmallVector<unsigned_int,_2UL> local_c38;
  Operand local_c10;
  undefined1 local_be0 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_bc0
  ;
  uint32_t local_bb8;
  uint32_t local_bb4;
  uint32_t subtype_6;
  undefined8 local_ba8;
  SmallVector<unsigned_int,_2UL> local_ba0;
  Operand local_b78;
  undefined1 local_b48 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_b28
  ;
  uint32_t local_b20;
  uint32_t local_b1c;
  uint32_t subtype_5;
  undefined8 local_b10;
  SmallVector<unsigned_int,_2UL> local_b08;
  uint32_t local_adc;
  iterator local_ad8;
  undefined8 local_ad0;
  SmallVector<unsigned_int,_2UL> local_ac8;
  Operand local_aa0;
  Operand OStack_a70;
  undefined1 local_a40 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_a20
  ;
  uint32_t local_a18;
  uint32_t local_a14;
  uint32_t subtype_4;
  undefined8 local_a08;
  SmallVector<unsigned_int,_2UL> local_a00;
  Operand local_9d8;
  undefined1 local_9a8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_988
  ;
  uint32_t local_980;
  AccessQualifier local_97c;
  uint32_t subtype_3;
  undefined8 local_970;
  SmallVector<unsigned_int,_2UL> local_968;
  ImageFormat local_93c;
  ImageFormat *local_938;
  undefined8 local_930;
  SmallVector<unsigned_int,_2UL> local_928;
  uint32_t local_8fc;
  iterator local_8f8;
  undefined8 local_8f0;
  SmallVector<unsigned_int,_2UL> local_8e8;
  uint local_8bc;
  iterator local_8b8;
  undefined8 local_8b0;
  SmallVector<unsigned_int,_2UL> local_8a8;
  uint local_87c;
  iterator local_878;
  undefined8 local_870;
  SmallVector<unsigned_int,_2UL> local_868;
  uint32_t local_83c;
  iterator local_838;
  undefined8 local_830;
  SmallVector<unsigned_int,_2UL> local_828;
  Dim local_7fc;
  Dim *local_7f8;
  undefined8 local_7f0;
  SmallVector<unsigned_int,_2UL> local_7e8;
  uint32_t local_7bc;
  iterator local_7b8;
  undefined8 local_7b0;
  SmallVector<unsigned_int,_2UL> local_7a8;
  Operand local_780;
  Operand OStack_750;
  Operand OStack_720;
  Operand OStack_6f0;
  Operand OStack_6c0;
  Operand OStack_690;
  Operand OStack_660;
  Operand OStack_630;
  undefined1 local_600 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_5e0
  ;
  uint32_t local_5d4;
  Image *pIStack_5d0;
  uint32_t subtype_2;
  Image *image;
  iterator local_5c0;
  undefined8 local_5b8;
  SmallVector<unsigned_int,_2UL> local_5b0;
  uint32_t local_584;
  iterator local_580;
  undefined8 local_578;
  SmallVector<unsigned_int,_2UL> local_570;
  Operand local_548;
  Operand OStack_518;
  undefined1 local_4e8 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_4c8
  ;
  uint32_t local_4c0;
  uint32_t local_4bc;
  uint32_t subtype_1;
  undefined8 local_4b0;
  SmallVector<unsigned_int,_2UL> local_4a8;
  uint32_t local_47c;
  iterator local_478;
  undefined8 local_470;
  SmallVector<unsigned_int,_2UL> local_468;
  Operand local_440;
  Operand OStack_410;
  undefined1 local_3e0 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_3c0
  ;
  uint32_t local_3b8;
  uint32_t local_3b4;
  uint32_t subtype;
  undefined8 local_3a8;
  SmallVector<unsigned_int,_2UL> local_3a0;
  Operand local_378;
  undefined1 local_348 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_328
  ;
  uint local_31c;
  iterator local_318;
  undefined8 local_310;
  SmallVector<unsigned_int,_2UL> local_308;
  uint32_t local_2dc;
  iterator local_2d8;
  undefined8 local_2d0;
  SmallVector<unsigned_int,_2UL> local_2c8;
  Operand local_2a0;
  Operand OStack_270;
  undefined1 local_240 [32];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_220
  ;
  initializer_list<spvtools::opt::Operand> local_218;
  int local_208;
  Op local_204;
  IRContext *local_200;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1f8
  ;
  initializer_list<spvtools::opt::Operand> local_1f0;
  int local_1e0;
  Op local_1dc;
  IRContext *local_1d8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1d0
  ;
  initializer_list<spvtools::opt::Operand> local_1c8;
  int local_1b8;
  Op local_1b4;
  IRContext *local_1b0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_1a8
  ;
  initializer_list<spvtools::opt::Operand> local_1a0;
  int local_190;
  Op local_18c;
  IRContext *local_188;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_180
  ;
  initializer_list<spvtools::opt::Operand> local_178;
  int local_168;
  Op local_164;
  IRContext *local_160;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_158
  ;
  initializer_list<spvtools::opt::Operand> local_150;
  int local_140;
  Op local_13c;
  IRContext *local_138;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_130
  ;
  initializer_list<spvtools::opt::Operand> local_128;
  int local_118;
  Op local_114;
  IRContext *local_110;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_108
  ;
  initializer_list<spvtools::opt::Operand> local_100;
  int local_f0;
  Op local_ec;
  IRContext *local_e8;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_e0;
  initializer_list<spvtools::opt::Operand> local_d8;
  int local_c8;
  Op local_c4;
  IRContext *local_c0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_b8;
  initializer_list<spvtools::opt::Operand> local_b0;
  int local_a0;
  Op local_9c;
  IRContext *local_98;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_90;
  initializer_list<spvtools::opt::Operand> local_88;
  int local_78;
  Op local_74;
  IRContext *local_70;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_68;
  initializer_list<spvtools::opt::Operand> local_60;
  int local_50;
  Op local_4c;
  IRContext *local_48;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_40;
  int local_34;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> typeInst;
  uint32_t id;
  Type *type_local;
  TypeManager *this_local;
  
  typeInst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ = GetId(this,type);
  if (typeInst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ != 0) {
    return typeInst._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  }
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&local_30);
  pIVar4 = context(this);
  typeInst._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
       IRContext::TakeNextId(pIVar4);
  if (typeInst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ == 0) {
    this_local._4_4_ = 0;
    local_34 = 1;
    goto LAB_008bf639;
  }
  RegisterType(this,typeInst._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_,
               type);
  KVar2 = analysis::Type::kind(type);
  switch(KVar2) {
  case kVoid:
    local_48 = context(this);
    local_4c = OpTypeVoid;
    local_50 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_60);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_40,&local_48,&local_4c,&local_50,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_60);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_40);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_40);
    break;
  case kBool:
    local_70 = context(this);
    local_74 = OpTypeBool;
    local_78 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_88);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_68,&local_70,&local_74,&local_78,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_88);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_68);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_68);
    break;
  case kInteger:
    local_240._24_8_ = context(this);
    local_240._20_4_ = 0x15;
    local_240._16_4_ = 0;
    iVar3 = (*type->_vptr_Type[10])();
    local_2dc = Integer::width((Integer *)CONCAT44(extraout_var,iVar3));
    local_2d8 = &local_2dc;
    local_2d0 = 1;
    init_list_42._M_len = 1;
    init_list_42._M_array = local_2d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c8,init_list_42);
    Operand::Operand(&local_2a0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_2c8);
    iVar3 = (*type->_vptr_Type[10])();
    bVar1 = Integer::IsSigned((Integer *)CONCAT44(extraout_var_00,iVar3));
    local_31c = (uint)bVar1;
    local_318 = &local_31c;
    local_310 = 1;
    init_list_41._M_len = 1;
    init_list_41._M_array = local_318;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_308,init_list_41);
    Operand::Operand(&OStack_270,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_308);
    local_240._0_8_ = &local_2a0;
    local_240._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_220,(IRContext **)(local_240 + 0x18),(Op *)(local_240 + 0x14),
               (int *)(local_240 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_240);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_220);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_220);
    local_1a18 = (Operand *)local_240;
    do {
      local_1a18 = local_1a18 + -1;
      Operand::~Operand(local_1a18);
    } while (local_1a18 != &local_2a0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_308);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2c8);
    break;
  case kFloat:
    local_348._24_8_ = context(this);
    local_348._20_4_ = 0x16;
    local_348._16_4_ = 0;
    iVar3 = (*type->_vptr_Type[0xc])();
    local_3b4 = Float::width((Float *)CONCAT44(extraout_var_01,iVar3));
    _subtype = &local_3b4;
    local_3a8 = 1;
    init_list_40._M_len = 1;
    init_list_40._M_array = _subtype;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_3a0,init_list_40);
    Operand::Operand(&local_378,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_3a0);
    local_348._0_8_ = &local_378;
    local_348._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_328,(IRContext **)(local_348 + 0x18),(Op *)(local_348 + 0x14),
               (int *)(local_348 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_348);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_328);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_328);
    local_1a38 = (Operand *)local_348;
    do {
      local_1a38 = local_1a38 + -1;
      Operand::~Operand(local_1a38);
    } while (local_1a38 != &local_378);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_3a0);
    break;
  case kVector:
    iVar3 = (*type->_vptr_Type[0xe])();
    pTVar8 = Vector::element_type((Vector *)CONCAT44(extraout_var_02,iVar3));
    local_3b8 = GetTypeInstruction(this,pTVar8);
    if (local_3b8 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_3e0._24_8_ = context(this);
    local_3e0._20_4_ = 0x17;
    local_3e0._16_4_ = 0;
    local_47c = local_3b8;
    local_478 = &local_47c;
    local_470 = 1;
    init_list_39._M_len = 1;
    init_list_39._M_array = local_478;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_468,init_list_39);
    Operand::Operand(&local_440,SPV_OPERAND_TYPE_ID,&local_468);
    iVar3 = (*type->_vptr_Type[0xe])();
    local_4bc = Vector::element_count((Vector *)CONCAT44(extraout_var_03,iVar3));
    _subtype_1 = &local_4bc;
    local_4b0 = 1;
    init_list_38._M_len = 1;
    init_list_38._M_array = _subtype_1;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_4a8,init_list_38);
    Operand::Operand(&OStack_410,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_4a8);
    local_3e0._0_8_ = &local_440;
    local_3e0._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_3c0,(IRContext **)(local_3e0 + 0x18),(Op *)(local_3e0 + 0x14),
               (int *)(local_3e0 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_3e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_3c0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_3c0);
    local_1a50 = (Operand *)local_3e0;
    do {
      local_1a50 = local_1a50 + -1;
      Operand::~Operand(local_1a50);
    } while (local_1a50 != &local_440);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_4a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_468);
    break;
  case kMatrix:
    iVar3 = (*type->_vptr_Type[0x10])();
    pTVar8 = Matrix::element_type((Matrix *)CONCAT44(extraout_var_04,iVar3));
    local_4c0 = GetTypeInstruction(this,pTVar8);
    if (local_4c0 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_4e8._24_8_ = context(this);
    local_4e8._20_4_ = 0x18;
    local_4e8._16_4_ = 0;
    local_584 = local_4c0;
    local_580 = &local_584;
    local_578 = 1;
    init_list_37._M_len = 1;
    init_list_37._M_array = local_580;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_570,init_list_37);
    Operand::Operand(&local_548,SPV_OPERAND_TYPE_ID,&local_570);
    iVar3 = (*type->_vptr_Type[0x10])();
    image._4_4_ = Matrix::element_count((Matrix *)CONCAT44(extraout_var_05,iVar3));
    local_5c0 = (iterator)((long)&image + 4);
    local_5b8 = 1;
    init_list_36._M_len = 1;
    init_list_36._M_array = local_5c0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_5b0,init_list_36);
    Operand::Operand(&OStack_518,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_5b0);
    local_4e8._0_8_ = &local_548;
    local_4e8._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_4c8,(IRContext **)(local_4e8 + 0x18),(Op *)(local_4e8 + 0x14),
               (int *)(local_4e8 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_4e8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_4c8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_4c8);
    local_1a70 = (Operand *)local_4e8;
    do {
      local_1a70 = local_1a70 + -1;
      Operand::~Operand(local_1a70);
    } while (local_1a70 != &local_548);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_5b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_570);
    break;
  case kImage:
    iVar3 = (*type->_vptr_Type[0x12])();
    pIStack_5d0 = (Image *)CONCAT44(extraout_var_06,iVar3);
    pTVar8 = Image::sampled_type(pIStack_5d0);
    local_5d4 = GetTypeInstruction(this,pTVar8);
    if (local_5d4 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_600._24_8_ = context(this);
    local_600._20_4_ = 0x19;
    local_600._16_4_ = 0;
    local_7bc = local_5d4;
    local_7b8 = &local_7bc;
    local_7b0 = 1;
    init_list_35._M_len = 1;
    init_list_35._M_array = local_7b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_7a8,init_list_35);
    Operand::Operand(&local_780,SPV_OPERAND_TYPE_ID,&local_7a8);
    local_7fc = Image::dim(pIStack_5d0);
    local_7f8 = &local_7fc;
    local_7f0 = 1;
    init_list_34._M_len = 1;
    init_list_34._M_array = local_7f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_7e8,init_list_34);
    Operand::Operand(&OStack_750,SPV_OPERAND_TYPE_DIMENSIONALITY,&local_7e8);
    local_83c = Image::depth(pIStack_5d0);
    local_838 = &local_83c;
    local_830 = 1;
    init_list_33._M_len = 1;
    init_list_33._M_array = local_838;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_828,init_list_33);
    Operand::Operand(&OStack_720,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_828);
    bVar1 = Image::is_arrayed(pIStack_5d0);
    local_87c = (uint)bVar1;
    local_878 = &local_87c;
    local_870 = 1;
    init_list_32._M_len = 1;
    init_list_32._M_array = local_878;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_868,init_list_32);
    Operand::Operand(&OStack_6f0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_868);
    bVar1 = Image::is_multisampled(pIStack_5d0);
    local_8bc = (uint)bVar1;
    local_8b8 = &local_8bc;
    local_8b0 = 1;
    init_list_31._M_len = 1;
    init_list_31._M_array = local_8b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_8a8,init_list_31);
    Operand::Operand(&OStack_6c0,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_8a8);
    local_8fc = Image::sampled(pIStack_5d0);
    local_8f8 = &local_8fc;
    local_8f0 = 1;
    init_list_30._M_len = 1;
    init_list_30._M_array = local_8f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_8e8,init_list_30);
    Operand::Operand(&OStack_690,SPV_OPERAND_TYPE_LITERAL_INTEGER,&local_8e8);
    local_93c = Image::format(pIStack_5d0);
    local_938 = &local_93c;
    local_930 = 1;
    init_list_29._M_len = 1;
    init_list_29._M_array = local_938;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_928,init_list_29);
    Operand::Operand(&OStack_660,SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,&local_928);
    local_97c = Image::access_qualifier(pIStack_5d0);
    _subtype_3 = &local_97c;
    local_970 = 1;
    init_list_28._M_len = 1;
    init_list_28._M_array = _subtype_3;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_968,init_list_28);
    Operand::Operand(&OStack_630,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,&local_968);
    local_600._0_8_ = &local_780;
    local_600._8_8_ = (_func_int **)0x8;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_5e0,(IRContext **)(local_600 + 0x18),(Op *)(local_600 + 0x14),
               (int *)(local_600 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_600);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_5e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_5e0);
    local_1a90 = (Operand *)local_600;
    do {
      local_1a90 = local_1a90 + -1;
      Operand::~Operand(local_1a90);
    } while (local_1a90 != &local_780);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_968);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_928);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_8e8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_8a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_868);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_828);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_7e8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_7a8);
    break;
  case kSampler:
    local_98 = context(this);
    local_9c = OpTypeSampler;
    local_a0 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_b0);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_90,&local_98,&local_9c,&local_a0,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_b0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_90);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_90);
    break;
  case kSampledImage:
    iVar3 = (*type->_vptr_Type[0x16])();
    pTVar8 = SampledImage::image_type((SampledImage *)CONCAT44(extraout_var_07,iVar3));
    local_980 = GetTypeInstruction(this,pTVar8);
    if (local_980 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_9a8._24_8_ = context(this);
    local_9a8._20_4_ = 0x1b;
    local_9a8._16_4_ = 0;
    local_a14 = local_980;
    _subtype_4 = &local_a14;
    local_a08 = 1;
    init_list_27._M_len = 1;
    init_list_27._M_array = _subtype_4;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_a00,init_list_27);
    Operand::Operand(&local_9d8,SPV_OPERAND_TYPE_ID,&local_a00);
    local_9a8._0_8_ = &local_9d8;
    local_9a8._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_988,(IRContext **)(local_9a8 + 0x18),(Op *)(local_9a8 + 0x14),
               (int *)(local_9a8 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_9a8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_988);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_988);
    local_1ae0 = (Operand *)local_9a8;
    do {
      local_1ae0 = local_1ae0 + -1;
      Operand::~Operand(local_1ae0);
    } while (local_1ae0 != &local_9d8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_a00);
    break;
  case kArray:
    iVar3 = (*type->_vptr_Type[0x18])();
    pTVar8 = Array::element_type((Array *)CONCAT44(extraout_var_08,iVar3));
    local_a18 = GetTypeInstruction(this,pTVar8);
    if (local_a18 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_a40._24_8_ = context(this);
    local_a40._20_4_ = 0x1c;
    local_a40._16_4_ = 0;
    local_adc = local_a18;
    local_ad8 = &local_adc;
    local_ad0 = 1;
    init_list_26._M_len = 1;
    init_list_26._M_array = local_ad8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ac8,init_list_26);
    Operand::Operand(&local_aa0,SPV_OPERAND_TYPE_ID,&local_ac8);
    iVar3 = (*type->_vptr_Type[0x18])();
    local_b1c = Array::LengthId((Array *)CONCAT44(extraout_var_09,iVar3));
    _subtype_5 = &local_b1c;
    local_b10 = 1;
    init_list_25._M_len = 1;
    init_list_25._M_array = _subtype_5;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_b08,init_list_25);
    Operand::Operand(&OStack_a70,SPV_OPERAND_TYPE_ID,&local_b08);
    local_a40._0_8_ = &local_aa0;
    local_a40._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_a20,(IRContext **)(local_a40 + 0x18),(Op *)(local_a40 + 0x14),
               (int *)(local_a40 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_a40);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_a20);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_a20);
    local_1af8 = (Operand *)local_a40;
    do {
      local_1af8 = local_1af8 + -1;
      Operand::~Operand(local_1af8);
    } while (local_1af8 != &local_aa0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_b08);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ac8);
    break;
  case kRuntimeArray:
    iVar3 = (*type->_vptr_Type[0x1a])();
    pTVar8 = RuntimeArray::element_type((RuntimeArray *)CONCAT44(extraout_var_10,iVar3));
    local_b20 = GetTypeInstruction(this,pTVar8);
    if (local_b20 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_b48._24_8_ = context(this);
    local_b48._20_4_ = 0x1d;
    local_b48._16_4_ = 0;
    local_bb4 = local_b20;
    _subtype_6 = &local_bb4;
    local_ba8 = 1;
    init_list_24._M_len = 1;
    init_list_24._M_array = _subtype_6;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ba0,init_list_24);
    Operand::Operand(&local_b78,SPV_OPERAND_TYPE_ID,&local_ba0);
    local_b48._0_8_ = &local_b78;
    local_b48._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b28,(IRContext **)(local_b48 + 0x18),(Op *)(local_b48 + 0x14),
               (int *)(local_b48 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_b48);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_b28);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_b28);
    local_1b18 = (Operand *)local_b48;
    do {
      local_1b18 = local_1b18 + -1;
      Operand::~Operand(local_1b18);
    } while (local_1b18 != &local_b78);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ba0);
    break;
  case kNodePayloadArrayAMDX:
    iVar3 = (*type->_vptr_Type[0x1c])();
    pTVar8 = NodePayloadArrayAMDX::element_type
                       ((NodePayloadArrayAMDX *)CONCAT44(extraout_var_11,iVar3));
    local_bb8 = GetTypeInstruction(this,pTVar8);
    if (local_bb8 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_be0._24_8_ = context(this);
    local_be0._20_4_ = 0x13d4;
    local_be0._16_4_ = 0;
    ops.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_bb8;
    init_list_23._M_len = 1;
    init_list_23._M_array =
         (iterator)
         ((long)&ops.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c38,init_list_23);
    Operand::Operand(&local_c10,SPV_OPERAND_TYPE_ID,&local_c38);
    local_be0._0_8_ = &local_c10;
    local_be0._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_bc0,(IRContext **)(local_be0 + 0x18),(Op *)(local_be0 + 0x14),
               (int *)(local_be0 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_be0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_bc0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_bc0);
    local_1b30 = (Operand *)local_be0;
    do {
      local_1b30 = local_1b30 + -1;
      Operand::~Operand(local_1b30);
    } while (local_1b30 != &local_c10);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c38);
    break;
  case kStruct:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&structTy)
    ;
    iVar3 = (*type->_vptr_Type[0x1e])();
    pvVar5 = Struct::element_types((Struct *)CONCAT44(extraout_var_12,iVar3));
    __end4 = std::
             vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
             ::begin(pvVar5);
    ty = (Type *)std::
                 vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                       *)&ty), bVar1) {
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                ::operator*(&__end4);
      pTStack_c90 = *ppTVar6;
      local_c94 = GetTypeInstruction(this,pTStack_c90);
      if (local_c94 == 0) {
        this_local._4_4_ = 0;
        local_34 = 1;
        goto LAB_008bdf54;
      }
      local_d00 = &local_d04;
      local_cf8 = 1;
      init_list_22._M_len = 1;
      init_list_22._M_array = local_d00;
      local_d04 = local_c94;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_cf0,init_list_22);
      Operand::Operand(&local_cc8,SPV_OPERAND_TYPE_ID,&local_cf0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &structTy,&local_cc8);
      Operand::~Operand(&local_cc8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_cf0);
      __gnu_cxx::
      __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
      ::operator++(&__end4);
    }
    local_d18 = context(this);
    opaque._4_4_ = 0x1e;
    opaque._0_4_ = 0;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
              ((spvtools *)&local_d10,&local_d18,(Op *)((long)&opaque + 4),(int *)&opaque,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&structTy)
    ;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_d10);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_d10);
    local_34 = 2;
LAB_008bdf54:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&structTy)
    ;
    goto joined_r0x008be561;
  case kOpaque:
    iVar3 = (*type->_vptr_Type[0x20])();
    words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_13,iVar3);
    input = Opaque::name_abi_cxx11_
                      ((Opaque *)
                       words.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage);
    utils::MakeVector((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d40,input);
    local_d68._24_8_ = context(this);
    local_d68._20_4_ = 0x1f;
    local_d68._16_4_ = 0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector
              ((SmallVector<unsigned_int,_2UL> *)&pointer,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d40);
    Operand::Operand(&local_d98,SPV_OPERAND_TYPE_LITERAL_STRING,(OperandData *)&pointer);
    local_d68._0_8_ = &local_d98;
    local_d68._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_d48,(IRContext **)(local_d68 + 0x18),(Op *)(local_d68 + 0x14),
               (int *)(local_d68 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_d68);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_d48);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_d48);
    local_1b48 = (Operand *)local_d68;
    do {
      local_1b48 = local_1b48 + -1;
      Operand::~Operand(local_1b48);
    } while (local_1b48 != &local_d98);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)&pointer);
    local_34 = 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_d40);
    break;
  case kPointer:
    iVar3 = (*type->_vptr_Type[0x22])();
    pPStack_dc8 = (Pointer *)CONCAT44(extraout_var_14,iVar3);
    pTVar8 = Pointer::pointee_type(pPStack_dc8);
    local_dcc = GetTypeInstruction(this,pTVar8);
    if (local_dcc == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_df8._24_8_ = context(this);
    local_df8._20_4_ = 0x20;
    local_df8._16_4_ = 0;
    local_e94 = Pointer::storage_class(pPStack_dc8);
    local_e90 = &local_e94;
    local_e88 = 1;
    init_list_21._M_len = 1;
    init_list_21._M_array = local_e90;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e80,init_list_21);
    Operand::Operand(&local_e58,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_e80);
    ops_1.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_dcc;
    init_list_20._M_len = 1;
    init_list_20._M_array =
         (iterator)
         ((long)&ops_1.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ec0,init_list_20);
    Operand::Operand(&OStack_e28,SPV_OPERAND_TYPE_ID,&local_ec0);
    local_df8._0_8_ = &local_e58;
    local_df8._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_dd8,(IRContext **)(local_df8 + 0x18),(Op *)(local_df8 + 0x14),
               (int *)(local_df8 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_df8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_dd8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_dd8);
    local_1b60 = (Operand *)local_df8;
    do {
      local_1b60 = local_1b60 + -1;
      Operand::~Operand(local_1b60);
    } while (local_1b60 != &local_e58);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ec0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e80);
    break;
  case kFunction:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&function)
    ;
    iVar3 = (*type->_vptr_Type[0x24])();
    pFStack_ef8 = (Function *)CONCAT44(extraout_var_15,iVar3);
    pTVar8 = analysis::Function::return_type(pFStack_ef8);
    local_efc = GetTypeInstruction(this,pTVar8);
    if (local_efc == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
    }
    else {
      local_f68 = (iterator)((long)&__range4_1 + 4);
      local_f60 = 1;
      init_list_19._M_len = 1;
      init_list_19._M_array = local_f68;
      __range4_1._4_4_ = local_efc;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_f58,init_list_19);
      Operand::Operand(&local_f30,SPV_OPERAND_TYPE_ID,&local_f58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &function,&local_f30);
      Operand::~Operand(&local_f30);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_f58);
      pvVar5 = analysis::Function::param_types(pFStack_ef8);
      __end4_1 = std::
                 vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                 ::begin(pvVar5);
      ty_1 = (Type *)std::
                     vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                     ::end(pvVar5);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4_1,
                                (__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                 *)&ty_1), bVar1) {
        ppTVar6 = __gnu_cxx::
                  __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                  ::operator*(&__end4_1);
        pTStack_f90 = *ppTVar6;
        local_f94 = GetTypeInstruction(this,pTStack_f90);
        if (local_f94 == 0) {
          this_local._4_4_ = 0;
          local_34 = 1;
          goto LAB_008be54f;
        }
        local_1000 = &local_1004;
        local_ff8 = 1;
        init_list_18._M_len = 1;
        init_list_18._M_array = local_1000;
        local_1004 = local_f94;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_ff0,init_list_18);
        Operand::Operand(&local_fc8,SPV_OPERAND_TYPE_ID,&local_ff0);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &function,&local_fc8);
        Operand::~Operand(&local_fc8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_ff0);
        __gnu_cxx::
        __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
        ::operator++(&__end4_1);
      }
      local_1018 = context(this);
      local_101c = OpTypeFunction;
      local_1020 = 0;
      MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
                ((spvtools *)&local_1010,&local_1018,&local_101c,&local_1020,
                 (uint *)((long)&typeInst._M_t.
                                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                 _M_head_impl + 4),
                 (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 &function);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::operator=(&local_30,&local_1010);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_1010);
      local_34 = 2;
    }
LAB_008be54f:
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&function)
    ;
joined_r0x008be561:
    if (local_34 != 2) goto LAB_008bf639;
    break;
  case kEvent:
    local_c0 = context(this);
    local_c4 = OpTypeEvent;
    local_c8 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_d8);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_b8,&local_c0,&local_c4,&local_c8,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_d8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_b8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_b8);
    break;
  case kDeviceEvent:
    local_e8 = context(this);
    local_ec = OpTypeDeviceEvent;
    local_f0 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_100);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_e0,&local_e8,&local_ec,&local_f0,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_100);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_e0);
    break;
  case kReserveId:
    local_110 = context(this);
    local_114 = OpTypeReserveId;
    local_118 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_128);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_108,&local_110,&local_114,&local_118,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_128);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_108);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_108);
    break;
  case kQueue:
    local_138 = context(this);
    local_13c = OpTypeQueue;
    local_140 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_150);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_130,&local_138,&local_13c,&local_140,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_150);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_130);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_130);
    break;
  case kPipe:
    local_1048._24_8_ = context(this);
    local_1048._20_4_ = 0x26;
    local_1048._16_4_ = 0;
    iVar3 = (*type->_vptr_Type[0x2e])();
    local_10b4 = Pipe::access_qualifier((Pipe *)CONCAT44(extraout_var_16,iVar3));
    local_10b0 = &local_10b4;
    local_10a8 = 1;
    init_list_17._M_len = 1;
    init_list_17._M_array = local_10b0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_10a0,init_list_17);
    Operand::Operand(&local_1078,SPV_OPERAND_TYPE_ACCESS_QUALIFIER,&local_10a0);
    local_1048._0_8_ = &local_1078;
    local_1048._8_8_ = (_func_int **)0x1;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1028,(IRContext **)(local_1048 + 0x18),(Op *)(local_1048 + 0x14),
               (int *)(local_1048 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_1048);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1028);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1028);
    local_1b80 = (Operand *)local_1048;
    do {
      local_1b80 = local_1b80 + -1;
      Operand::~Operand(local_1b80);
    } while (local_1b80 != &local_1078);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_10a0);
    break;
  case kForwardPointer:
    local_10e8._32_8_ = context(this);
    local_10e8[0x1c] = '\'';
    local_10e8[0x1d] = '\0';
    local_10e8[0x1e] = '\0';
    local_10e8[0x1f] = '\0';
    local_10e8[0x18] = '\0';
    local_10e8[0x19] = '\0';
    local_10e8[0x1a] = '\0';
    local_10e8[0x1b] = '\0';
    local_10e8._20_4_ = 0;
    iVar3 = (*type->_vptr_Type[0x30])();
    local_1184 = ForwardPointer::target_id((ForwardPointer *)CONCAT44(extraout_var_17,iVar3));
    local_1180 = &local_1184;
    local_1178 = 1;
    init_list_16._M_len = 1;
    init_list_16._M_array = local_1180;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1170,init_list_16);
    Operand::Operand(&local_1148,SPV_OPERAND_TYPE_ID,&local_1170);
    iVar3 = (*type->_vptr_Type[0x30])();
    coop_mat._4_4_ =
         ForwardPointer::storage_class((ForwardPointer *)CONCAT44(extraout_var_18,iVar3));
    local_11c0 = (iterator)((long)&coop_mat + 4);
    local_11b8 = 1;
    init_list_15._M_len = 1;
    init_list_15._M_array = local_11c0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_11b0,init_list_15);
    Operand::Operand(&OStack_1118,SPV_OPERAND_TYPE_STORAGE_CLASS,&local_11b0);
    local_10e8._0_8_ = &local_1148;
    local_10e8._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_10c0,(IRContext **)(local_10e8 + 0x20),(Op *)(local_10e8 + 0x1c),
               (int *)(local_10e8 + 0x18),(int *)(local_10e8 + 0x14),
               (initializer_list<spvtools::opt::Operand> *)local_10e8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_10c0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_10c0);
    local_1b98 = (Operand *)local_10e8;
    do {
      local_1b98 = local_1b98 + -1;
      Operand::~Operand(local_1b98);
    } while (local_1b98 != &local_1148);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_11b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1170);
    break;
  case kPipeStorage:
    local_160 = context(this);
    local_164 = OpTypePipeStorage;
    local_168 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_178);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_158,&local_160,&local_164,&local_168,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_178);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_158);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_158);
    break;
  case kNamedBarrier:
    local_188 = context(this);
    local_18c = OpTypeNamedBarrier;
    local_190 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_1a0);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_180,&local_188,&local_18c,&local_190,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_1a0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_180);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_180);
    break;
  case kAccelerationStructureNV:
    local_1b0 = context(this);
    local_1b4 = OpTypeAccelerationStructureKHR;
    local_1b8 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_1c8);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1a8,&local_1b0,&local_1b4,&local_1b8,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_1c8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1a8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1a8);
    break;
  case kCooperativeMatrixNV:
    iVar3 = (*type->_vptr_Type[0x38])();
    pCStack_11d0 = (CooperativeMatrixNV *)CONCAT44(extraout_var_19,iVar3);
    pTVar8 = CooperativeMatrixNV::component_type(pCStack_11d0);
    local_11d4 = GetTypeInstruction(this,pTVar8);
    if (local_11d4 == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_1200._24_8_ = context(this);
    local_1200._20_4_ = 0x14ee;
    local_1200._16_4_ = 0;
    local_12fc = local_11d4;
    local_12f8 = &local_12fc;
    local_12f0 = 1;
    init_list_14._M_len = 1;
    init_list_14._M_array = local_12f8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_12e8,init_list_14);
    Operand::Operand(&local_12c0,SPV_OPERAND_TYPE_ID,&local_12e8);
    local_133c = CooperativeMatrixNV::scope_id(pCStack_11d0);
    local_1338 = &local_133c;
    local_1330 = 1;
    init_list_13._M_len = 1;
    init_list_13._M_array = local_1338;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1328,init_list_13);
    Operand::Operand(&OStack_1290,SPV_OPERAND_TYPE_SCOPE_ID,&local_1328);
    local_137c = CooperativeMatrixNV::rows_id(pCStack_11d0);
    local_1378 = &local_137c;
    local_1370 = 1;
    init_list_12._M_len = 1;
    init_list_12._M_array = local_1378;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1368,init_list_12);
    Operand::Operand(&OStack_1260,SPV_OPERAND_TYPE_ID,&local_1368);
    coop_mat_1._4_4_ = CooperativeMatrixNV::columns_id(pCStack_11d0);
    local_13b8 = (iterator)((long)&coop_mat_1 + 4);
    local_13b0 = 1;
    init_list_11._M_len = 1;
    init_list_11._M_array = local_13b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_13a8,init_list_11);
    Operand::Operand(&OStack_1230,SPV_OPERAND_TYPE_ID,&local_13a8);
    local_1200._0_8_ = &local_12c0;
    local_1200._8_8_ = (_func_int **)0x4;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_11e0,(IRContext **)(local_1200 + 0x18),(Op *)(local_1200 + 0x14),
               (int *)(local_1200 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_1200);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_11e0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_11e0);
    local_1bb8 = (Operand *)local_1200;
    do {
      local_1bb8 = local_1bb8 + -1;
      Operand::~Operand(local_1bb8);
    } while (local_1bb8 != &local_12c0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_13a8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1368);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1328);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_12e8);
    break;
  case kCooperativeMatrixKHR:
    iVar3 = (*type->_vptr_Type[0x3a])();
    pCStack_13c8 = (CooperativeMatrixKHR *)CONCAT44(extraout_var_20,iVar3);
    pTVar8 = CooperativeMatrixKHR::component_type(pCStack_13c8);
    local_13cc = GetTypeInstruction(this,pTVar8);
    if (local_13cc == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_13f8._24_8_ = context(this);
    local_13f8._20_4_ = 0x1168;
    local_13f8._16_4_ = 0;
    local_1524 = local_13cc;
    local_1520 = &local_1524;
    local_1518 = 1;
    init_list_10._M_len = 1;
    init_list_10._M_array = local_1520;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1510,init_list_10);
    Operand::Operand(&local_14e8,SPV_OPERAND_TYPE_ID,&local_1510);
    local_1564 = CooperativeMatrixKHR::scope_id(pCStack_13c8);
    local_1560 = &local_1564;
    local_1558 = 1;
    init_list_09._M_len = 1;
    init_list_09._M_array = local_1560;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1550,init_list_09);
    Operand::Operand(&OStack_14b8,SPV_OPERAND_TYPE_SCOPE_ID,&local_1550);
    local_15a4 = CooperativeMatrixKHR::rows_id(pCStack_13c8);
    local_15a0 = &local_15a4;
    local_1598 = 1;
    init_list_08._M_len = 1;
    init_list_08._M_array = local_15a0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1590,init_list_08);
    Operand::Operand(&OStack_1488,SPV_OPERAND_TYPE_ID,&local_1590);
    local_15e4 = CooperativeMatrixKHR::columns_id(pCStack_13c8);
    local_15e0 = &local_15e4;
    local_15d8 = 1;
    init_list_07._M_len = 1;
    init_list_07._M_array = local_15e0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_15d0,init_list_07);
    Operand::Operand(&OStack_1458,SPV_OPERAND_TYPE_ID,&local_15d0);
    tensor_layout._4_4_ = CooperativeMatrixKHR::use_id(pCStack_13c8);
    local_1620 = (iterator)((long)&tensor_layout + 4);
    local_1618 = 1;
    init_list_06._M_len = 1;
    init_list_06._M_array = local_1620;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1610,init_list_06);
    Operand::Operand(&OStack_1428,SPV_OPERAND_TYPE_ID,&local_1610);
    local_13f8._0_8_ = &local_14e8;
    local_13f8._8_8_ = (_func_int **)0x5;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_13d8,(IRContext **)(local_13f8 + 0x18),(Op *)(local_13f8 + 0x14),
               (int *)(local_13f8 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_13f8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_13d8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_13d8);
    local_1be8 = (Operand *)local_13f8;
    do {
      local_1be8 = local_1be8 + -1;
      Operand::~Operand(local_1be8);
    } while (local_1be8 != &local_14e8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1610);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_15d0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1590);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1550);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1510);
    break;
  case kCooperativeVectorNV:
    iVar3 = (*type->_vptr_Type[0x3c])();
    pCStack_18e8 = (CooperativeVectorNV *)CONCAT44(extraout_var_23,iVar3);
    pTVar8 = CooperativeVectorNV::component_type(pCStack_18e8);
    local_18ec = GetTypeInstruction(this,pTVar8);
    if (local_18ec == 0) {
      this_local._4_4_ = 0;
      local_34 = 1;
      goto LAB_008bf639;
    }
    local_1918._24_8_ = context(this);
    local_1918._20_4_ = 0x14a8;
    local_1918._16_4_ = 0;
    local_19b4 = local_18ec;
    local_19b0 = (_Invoker_type)&local_19b4;
    local_19a8._M_head_impl = (DefUseManager *)0x1;
    init_list_00._M_len = 1;
    init_list_00._M_array = (iterator)local_19b0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_19a0,init_list_00);
    Operand::Operand(&local_1978,SPV_OPERAND_TYPE_ID,&local_19a0);
    local_1a00._12_4_ = CooperativeVectorNV::components(pCStack_18e8);
    local_19f0 = (spv_operand_table)(local_1a00 + 0xc);
    local_19e8 = (spv_opcode_table)0x1;
    init_list._M_len = 1;
    init_list._M_array = (iterator)local_19f0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_19e0,init_list);
    Operand::Operand(&OStack_1948,SPV_OPERAND_TYPE_ID,&local_19e0);
    local_1918._0_8_ = &local_1978;
    local_1918._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_18f8,(IRContext **)(local_1918 + 0x18),(Op *)(local_1918 + 0x14),
               (int *)(local_1918 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_1918);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_18f8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_18f8);
    local_1c40 = (Operand *)local_1918;
    do {
      local_1c40 = local_1c40 + -1;
      Operand::~Operand(local_1c40);
    } while (local_1c40 != &local_1978);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_19e0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_19a0);
    break;
  case kRayQueryKHR:
    local_1d8 = context(this);
    local_1dc = OpTypeRayQueryKHR;
    local_1e0 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_1f0);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1d0,&local_1d8,&local_1dc,&local_1e0,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_1f0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1d0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1d0);
    break;
  case kHitObjectNV:
    local_200 = context(this);
    local_204 = OpTypeHitObjectNV;
    local_208 = 0;
    std::initializer_list<spvtools::opt::Operand>::initializer_list(&local_218);
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1f8,&local_200,&local_204,&local_208,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),&local_218);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1f8);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1f8);
    break;
  case kTensorLayoutNV:
    local_1630._M_head_impl._0_4_ = (*type->_vptr_Type[0x42])();
    local_1630._M_head_impl._4_4_ = extraout_var_21;
    local_1658._24_8_ = context(this);
    local_1658._20_4_ = 0x14fa;
    local_1658._16_4_ = 0;
    local_16f4 = TensorLayoutNV::dim_id((TensorLayoutNV *)local_1630._M_head_impl);
    local_16f0 = &local_16f4;
    local_16e8 = 1;
    init_list_05._M_len = 1;
    init_list_05._M_array = local_16f0;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_16e0,init_list_05);
    Operand::Operand(&local_16b8,SPV_OPERAND_TYPE_ID,&local_16e0);
    tensor_view._4_4_ = TensorLayoutNV::clamp_mode_id((TensorLayoutNV *)local_1630._M_head_impl);
    local_1730 = (iterator)((long)&tensor_view + 4);
    local_1728 = 1;
    init_list_04._M_len = 1;
    init_list_04._M_array = local_1730;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1720,init_list_04);
    Operand::Operand(&OStack_1688,SPV_OPERAND_TYPE_ID,&local_1720);
    local_1658._0_8_ = &local_16b8;
    local_1658._8_8_ = (_func_int **)0x2;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::initializer_list<spvtools::opt::Operand>>
              ((spvtools *)&local_1638,(IRContext **)(local_1658 + 0x18),(Op *)(local_1658 + 0x14),
               (int *)(local_1658 + 0x10),
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (initializer_list<spvtools::opt::Operand> *)local_1658);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_1638);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_1638);
    local_1c20 = (Operand *)local_1658;
    do {
      local_1c20 = local_1c20 + -1;
      Operand::~Operand(local_1c20);
    } while (local_1c20 != &local_16b8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1720);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_16e0);
    break;
  case kTensorViewNV:
    iVar3 = (*type->_vptr_Type[0x44])();
    operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_22,iVar3);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_1758
              );
    local_17c4 = TensorViewNV::dim_id
                           ((TensorViewNV *)
                            operands.
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_17c0._M_head_impl = (LivenessManager *)&local_17c4;
    local_17b8._0_4_ = 1;
    local_17b8._4_1_ = false;
    local_17b8._5_1_ = false;
    local_17b8._6_2_ = 0;
    init_list_03._M_len = 1;
    init_list_03._M_array = (iterator)local_17c0._M_head_impl;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_17b0,init_list_03);
    Operand::Operand(&local_1788,SPV_OPERAND_TYPE_ID,&local_17b0);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_1758
               ,&local_1788);
    Operand::~Operand(&local_1788);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_17b0);
    __range4_2._4_4_ =
         TensorViewNV::has_dimensions_id
                   ((TensorViewNV *)
                    operands.
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_1830._M_nxt = (_Hash_node_base *)((long)&__range4_2 + 4);
    local_1828 = 1;
    init_list_02._M_len = 1;
    init_list_02._M_array = (iterator)local_1830._M_nxt;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1820,init_list_02);
    Operand::Operand(&local_17f8,SPV_OPERAND_TYPE_ID,&local_1820);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_1758
               ,&local_17f8);
    Operand::~Operand(&local_17f8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1820);
    this_00 = TensorViewNV::perm((TensorViewNV *)
                                 operands.
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __end4_2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_00);
    cStack_1850 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=(&__end4_2,&stack0xffffffffffffe7b0), bVar1) {
      puVar7 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end4_2);
      local_18c4 = *puVar7;
      local_18c0 = &local_18c4;
      local_18b8 = 1;
      init_list_01._M_len = 1;
      init_list_01._M_array = local_18c0;
      local_1854 = local_18c4;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_18b0,init_list_01);
      Operand::Operand(&local_1888,SPV_OPERAND_TYPE_ID,&local_18b0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                 local_1758,&local_1888);
      Operand::~Operand(&local_1888);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_18b0);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end4_2);
    }
    local_18d8 = context(this);
    coop_vec._4_4_ = 0x14fb;
    coop_vec._0_4_ = 0;
    MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>&>
              ((spvtools *)&local_18d0,&local_18d8,(Op *)((long)&coop_vec + 4),(int *)&coop_vec,
               (uint *)((long)&typeInst._M_t.
                               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                               _M_head_impl + 4),
               (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_1758
              );
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    operator=(&local_30,&local_18d0);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_18d0);
    local_34 = 2;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_1758
              );
    break;
  default:
    __assert_fail("false && \"Unexpected type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/type_manager.cpp"
                  ,0x1ee,
                  "uint32_t spvtools::opt::analysis::TypeManager::GetTypeInstruction(const Type *)")
    ;
  }
  pIVar4 = context(this);
  IRContext::AddType(pIVar4,&local_30);
  pIVar4 = context(this);
  context(this);
  IRContext::types_values_end((IRContext *)local_1a00);
  this_01 = &InstructionList::iterator::operator--((iterator *)local_1a00)->super_iterator;
  inst = utils::IntrusiveList<spvtools::opt::Instruction>::
         iterator_template<spvtools::opt::Instruction>::operator*(this_01);
  IRContext::AnalyzeDefUse(pIVar4,inst);
  AttachDecorations(this,typeInst._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                         .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl.
                         _4_4_,type);
  this_local._4_4_ =
       typeInst._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
  local_34 = 1;
LAB_008bf639:
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  return this_local._4_4_;
}

Assistant:

uint32_t TypeManager::GetTypeInstruction(const Type* type) {
  uint32_t id = GetId(type);
  if (id != 0) return id;

  std::unique_ptr<Instruction> typeInst;
  // TODO(1841): Handle id overflow.
  id = context()->TakeNextId();
  if (id == 0) {
    return 0;
  }

  RegisterType(id, *type);
  switch (type->kind()) {
#define DefineParameterlessCase(kind)                                         \
  case Type::k##kind:                                                         \
    typeInst = MakeUnique<Instruction>(context(), spv::Op::OpType##kind, 0,   \
                                       id, std::initializer_list<Operand>{}); \
    break
    DefineParameterlessCase(Void);
    DefineParameterlessCase(Bool);
    DefineParameterlessCase(Sampler);
    DefineParameterlessCase(Event);
    DefineParameterlessCase(DeviceEvent);
    DefineParameterlessCase(ReserveId);
    DefineParameterlessCase(Queue);
    DefineParameterlessCase(PipeStorage);
    DefineParameterlessCase(NamedBarrier);
    DefineParameterlessCase(AccelerationStructureNV);
    DefineParameterlessCase(RayQueryKHR);
    DefineParameterlessCase(HitObjectNV);
#undef DefineParameterlessCase
    case Type::kInteger:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeInt, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsInteger()->width()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(type->AsInteger()->IsSigned() ? 1u : 0u)}}});
      break;
    case Type::kFloat:
      // TODO: Handle FP encoding enums once actually used.
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeFloat, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {type->AsFloat()->width()}}});
      break;
    case Type::kVector: {
      uint32_t subtype = GetTypeInstruction(type->AsVector()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeVector, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsVector()->element_count()}}});
      break;
    }
    case Type::kMatrix: {
      uint32_t subtype = GetTypeInstruction(type->AsMatrix()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeMatrix, 0, id,
                                  std::initializer_list<Operand>{
                                      {SPV_OPERAND_TYPE_ID, {subtype}},
                                      {SPV_OPERAND_TYPE_LITERAL_INTEGER,
                                       {type->AsMatrix()->element_count()}}});
      break;
    }
    case Type::kImage: {
      const Image* image = type->AsImage();
      uint32_t subtype = GetTypeInstruction(image->sampled_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeImage, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_DIMENSIONALITY,
               {static_cast<uint32_t>(image->dim())}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->depth()}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_arrayed() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER,
               {(image->is_multisampled() ? 1u : 0u)}},
              {SPV_OPERAND_TYPE_LITERAL_INTEGER, {image->sampled()}},
              {SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT,
               {static_cast<uint32_t>(image->format())}},
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(image->access_qualifier())}}});
      break;
    }
    case Type::kSampledImage: {
      uint32_t subtype =
          GetTypeInstruction(type->AsSampledImage()->image_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeSampledImage, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kArray: {
      uint32_t subtype = GetTypeInstruction(type->AsArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeArray, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {subtype}},
              {SPV_OPERAND_TYPE_ID, {type->AsArray()->LengthId()}}});
      break;
    }
    case Type::kRuntimeArray: {
      uint32_t subtype =
          GetTypeInstruction(type->AsRuntimeArray()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeRuntimeArray, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kNodePayloadArrayAMDX: {
      uint32_t subtype =
          GetTypeInstruction(type->AsNodePayloadArrayAMDX()->element_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeNodePayloadArrayAMDX, 0, id,
          std::initializer_list<Operand>{{SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kStruct: {
      std::vector<Operand> ops;
      const Struct* structTy = type->AsStruct();
      for (auto ty : structTy->element_types()) {
        uint32_t member_type_id = GetTypeInstruction(ty);
        if (member_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {member_type_id}));
      }
      typeInst =
          MakeUnique<Instruction>(context(), spv::Op::OpTypeStruct, 0, id, ops);
      break;
    }
    case Type::kOpaque: {
      const Opaque* opaque = type->AsOpaque();
      // Convert to null-terminated packed UTF-8 string.
      std::vector<uint32_t> words = spvtools::utils::MakeVector(opaque->name());
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeOpaque, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_LITERAL_STRING, words}});
      break;
    }
    case Type::kPointer: {
      const Pointer* pointer = type->AsPointer();
      uint32_t subtype = GetTypeInstruction(pointer->pointee_type());
      if (subtype == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePointer, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(pointer->storage_class())}},
              {SPV_OPERAND_TYPE_ID, {subtype}}});
      break;
    }
    case Type::kFunction: {
      std::vector<Operand> ops;
      const Function* function = type->AsFunction();
      uint32_t return_type_id = GetTypeInstruction(function->return_type());
      if (return_type_id == 0) {
        return 0;
      }
      ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {return_type_id}));
      for (auto ty : function->param_types()) {
        uint32_t paramater_type_id = GetTypeInstruction(ty);
        if (paramater_type_id == 0) {
          return 0;
        }
        ops.push_back(Operand(SPV_OPERAND_TYPE_ID, {paramater_type_id}));
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeFunction, 0,
                                         id, ops);
      break;
    }
    case Type::kPipe:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypePipe, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ACCESS_QUALIFIER,
               {static_cast<uint32_t>(type->AsPipe()->access_qualifier())}}});
      break;
    case Type::kForwardPointer:
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeForwardPointer, 0, 0,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {type->AsForwardPointer()->target_id()}},
              {SPV_OPERAND_TYPE_STORAGE_CLASS,
               {static_cast<uint32_t>(
                   type->AsForwardPointer()->storage_class())}}});
      break;
    case Type::kCooperativeMatrixNV: {
      auto coop_mat = type->AsCooperativeMatrixNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}}});
      break;
    }
    case Type::kCooperativeMatrixKHR: {
      auto coop_mat = type->AsCooperativeMatrixKHR();
      uint32_t const component_type =
          GetTypeInstruction(coop_mat->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeMatrixKHR, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_SCOPE_ID, {coop_mat->scope_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->rows_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->columns_id()}},
              {SPV_OPERAND_TYPE_ID, {coop_mat->use_id()}}});
      break;
    }
    case Type::kTensorLayoutNV: {
      auto tensor_layout = type->AsTensorLayoutNV();
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeTensorLayoutNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {tensor_layout->dim_id()}},
              {SPV_OPERAND_TYPE_ID, {tensor_layout->clamp_mode_id()}}});
      break;
    }
    case Type::kTensorViewNV: {
      auto tensor_view = type->AsTensorViewNV();
      std::vector<Operand> operands;
      operands.push_back(Operand{SPV_OPERAND_TYPE_ID, {tensor_view->dim_id()}});
      operands.push_back(
          Operand{SPV_OPERAND_TYPE_ID, {tensor_view->has_dimensions_id()}});
      for (auto p : tensor_view->perm()) {
        operands.push_back(Operand{SPV_OPERAND_TYPE_ID, {p}});
      }
      typeInst = MakeUnique<Instruction>(context(), spv::Op::OpTypeTensorViewNV,
                                         0, id, operands);
      break;
    }
    case Type::kCooperativeVectorNV: {
      auto coop_vec = type->AsCooperativeVectorNV();
      uint32_t const component_type =
          GetTypeInstruction(coop_vec->component_type());
      if (component_type == 0) {
        return 0;
      }
      typeInst = MakeUnique<Instruction>(
          context(), spv::Op::OpTypeCooperativeVectorNV, 0, id,
          std::initializer_list<Operand>{
              {SPV_OPERAND_TYPE_ID, {component_type}},
              {SPV_OPERAND_TYPE_ID, {coop_vec->components()}}});
      break;
    }
    default:
      assert(false && "Unexpected type");
      break;
  }
  context()->AddType(std::move(typeInst));
  context()->AnalyzeDefUse(&*--context()->types_values_end());
  AttachDecorations(id, type);
  return id;
}